

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::TextFlow::Columns::iterator::iterator(iterator *this,Columns *columns)

{
  pointer pCVar1;
  size_type __n;
  Column *col;
  pointer column;
  const_iterator local_60;
  
  this->m_columns = &columns->m_columns;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = (long)(columns->m_columns).
              super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(columns->m_columns).
              super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>.
              _M_impl.super__Vector_impl_data._M_start >> 6;
  this->m_activeIterators = __n;
  std::
  vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ::reserve(&this->m_iterators,__n);
  pCVar1 = (this->m_columns->
           super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (column = (this->m_columns->
                super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                )._M_impl.super__Vector_impl_data._M_start; column != pCVar1; column = column + 1) {
    Column::const_iterator::const_iterator(&local_60,column);
    std::
    vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
    ::emplace_back<Catch::TextFlow::Column::const_iterator>(&this->m_iterators,&local_60);
  }
  return;
}

Assistant:

Columns::iterator::iterator( Columns const& columns ):
            m_columns( columns.m_columns ),
            m_activeIterators( m_columns.size() ) {

            m_iterators.reserve( m_columns.size() );
            for ( auto const& col : m_columns ) {
                m_iterators.push_back( col.begin() );
            }
        }